

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest12Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section10ValidPolicyMappingTest12Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.10.12";
  local_88.should_validate = true;
  PkitsTestInfo::SetInitialPolicySet(&local_88,"NIST-test-policy-1");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a5940,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005a5960,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest12Subpart1) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "P12Mapping1to3CACert",
                               "ValidPolicyMappingTest12EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "P12Mapping1to3CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.12";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-1");

  this->RunTest(certs, crls, info);
}